

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darts.h
# Opt level: O2

void __thiscall
Darts::Details::DoubleArrayBuilder::build_from_keyset<int>
          (DoubleArrayBuilder *this,Keyset<int> *keyset,size_t begin,size_t end,size_t depth,
          id_type dic_id)

{
  id_type iVar1;
  size_t *psVar2;
  byte bVar3;
  size_t sVar4;
  byte bVar5;
  size_t sVar6;
  
LAB_00229c23:
  iVar1 = arrange_from_keyset<int>(this,keyset,begin,end,depth,dic_id);
  psVar2 = keyset->lengths_;
  sVar6 = end;
  if (end < begin) {
    sVar6 = begin;
  }
  while ((sVar4 = sVar6, begin < end &&
         (((psVar2 != (size_t *)0x0 && (psVar2[begin] <= depth)) ||
          (sVar4 = begin, keyset->keys_[begin][depth] == '\0'))))) {
    begin = begin + 1;
  }
  if (sVar4 == end) {
    return;
  }
  if ((psVar2 == (size_t *)0x0) || (depth < psVar2[sVar4])) {
    bVar3 = keyset->keys_[sVar4][depth];
  }
  else {
    bVar3 = 0;
  }
  begin = sVar4;
  do {
    sVar6 = begin;
    do {
      sVar6 = sVar6 + 1;
      if (end <= sVar6) {
        dic_id = iVar1 ^ bVar3;
        depth = depth + 1;
        goto LAB_00229c23;
      }
      if ((psVar2 == (size_t *)0x0) || (depth < psVar2[sVar6])) {
        bVar5 = keyset->keys_[sVar6][depth];
      }
      else {
        bVar5 = 0;
      }
    } while (bVar5 == bVar3);
    build_from_keyset<int>(this,keyset,begin,sVar6,depth + 1,bVar3 ^ iVar1);
    psVar2 = keyset->lengths_;
    begin = sVar6;
    if ((psVar2 == (size_t *)0x0) || (bVar3 = 0, depth < psVar2[sVar6])) {
      bVar3 = keyset->keys_[sVar6][depth];
    }
  } while( true );
}

Assistant:

void DoubleArrayBuilder::build_from_keyset(const Keyset<T> &keyset,
    std::size_t begin, std::size_t end, std::size_t depth, id_type dic_id) {
  id_type offset = arrange_from_keyset(keyset, begin, end, depth, dic_id);

  while (begin < end) {
    if (keyset.keys(begin, depth) != '\0') {
      break;
    }
    ++begin;
  }
  if (begin == end) {
    return;
  }

  std::size_t last_begin = begin;
  uchar_type last_label = keyset.keys(begin, depth);
  while (++begin < end) {
    uchar_type label = keyset.keys(begin, depth);
    if (label != last_label) {
      build_from_keyset(keyset, last_begin, begin,
          depth + 1, offset ^ last_label);
      last_begin = begin;
      last_label = keyset.keys(begin, depth);
    }
  }
  build_from_keyset(keyset, last_begin, end, depth + 1, offset ^ last_label);
}